

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemmodeltester.cpp
# Opt level: O0

void __thiscall
QAbstractItemModelTesterPrivate::rowsAboutToBeMoved
          (QAbstractItemModelTesterPrivate *this,QModelIndex *sourceParent,int sourceStart,
          int sourceEnd,QModelIndex *destinationParent,int destinationRow)

{
  long lVar1;
  bool bVar2;
  QDebug *pQVar3;
  QAbstractItemModel *pQVar4;
  undefined4 in_ECX;
  undefined4 in_EDX;
  char *in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  undefined4 uVar5;
  int in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  QString *in_stack_fffffffffffffeb8;
  QMessageLogger *in_stack_fffffffffffffec0;
  QDebug *in_stack_fffffffffffffed8;
  char *t;
  ChangeInFlight *in_stack_ffffffffffffff60;
  ChangeInFlight *in_stack_ffffffffffffff68;
  QAbstractItemModelTesterPrivate *in_stack_ffffffffffffff70;
  char local_88 [32];
  QDebug local_68;
  QDebug local_60;
  QDebug local_58;
  QDebug local_50;
  QDebug local_48;
  undefined4 local_3c;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 local_28 [8];
  undefined4 in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = 0;
  uVar5 = 0x36e;
  bVar2 = compare<QAbstractItemModelTesterPrivate::ChangeInFlight,QAbstractItemModelTesterPrivate::ChangeInFlight>
                    (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                     in_RDI,in_RSI,(char *)CONCAT44(in_EDX,in_ECX),in_stack_ffffffffffffffe0);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    in_RDI[0xc4] = '\a';
    in_RDI[0xc5] = '\0';
    in_RDI[0xc6] = '\0';
    in_RDI[199] = '\0';
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    lcModelTest();
    anon_unknown.dwarf_21e2d9::QLoggingCategoryMacroHolder<(QtMsgType)0>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
               CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
               (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffeac,uVar5));
    while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_38), bVar2) {
      anon_unknown.dwarf_21e2d9::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x190cde);
      t = local_88;
      QMessageLogger::QMessageLogger
                (in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8,
                 in_stack_fffffffffffffeb4,(char *)CONCAT44(in_stack_fffffffffffffeac,uVar5),
                 (char *)0x190cfa);
      QMessageLogger::debug();
      QDebug::operator<<(in_stack_fffffffffffffed8,t);
      QDebug::operator<<(in_stack_fffffffffffffed8,t);
      QDebug::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                         in_stack_fffffffffffffeac);
      QDebug::operator<<(in_stack_fffffffffffffed8,t);
      QDebug::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                         in_stack_fffffffffffffeac);
      pQVar3 = QDebug::operator<<(in_stack_fffffffffffffed8,t);
      QDebug::QDebug(&local_60,pQVar3);
      ::operator<<((Stream *)&local_58,(QModelIndex *)&local_60);
      in_stack_fffffffffffffed8 = QDebug::operator<<(in_stack_fffffffffffffed8,t);
      pQVar4 = QPointer<QAbstractItemModel>::operator->((QPointer<QAbstractItemModel> *)0x190dfd);
      (**(code **)(*(long *)pQVar4 + 0x90))(local_28,pQVar4,in_RSI,0);
      QVariant::toString();
      QDebug::operator<<((QDebug *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      pQVar3 = QDebug::operator<<(in_stack_fffffffffffffed8,t);
      QDebug::QDebug(&local_50,pQVar3);
      ::operator<<((Stream *)&local_48,(QModelIndex *)&local_50);
      in_stack_fffffffffffffec0 = (QMessageLogger *)QDebug::operator<<(in_stack_fffffffffffffed8,t);
      QDebug::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                         in_stack_fffffffffffffeac);
      QDebug::~QDebug(&local_48);
      QDebug::~QDebug(&local_50);
      QString::~QString((QString *)0x190ef0);
      QVariant::~QVariant((QVariant *)local_28);
      QDebug::~QDebug(&local_58);
      QDebug::~QDebug(&local_60);
      QDebug::~QDebug(&local_68);
      local_30 = (undefined1 *)((ulong)local_30 & 0xffffffffffffff00);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemModelTesterPrivate::rowsAboutToBeMoved(const QModelIndex &sourceParent,
                                                         int sourceStart, int sourceEnd,
                                                         const QModelIndex &destinationParent,
                                                         int destinationRow)
{
    MODELTESTER_COMPARE(changeInFlight, ChangeInFlight::None);
    changeInFlight = ChangeInFlight::RowsMoved;

    qCDebug(lcModelTest) << "rowsAboutToBeMoved"
                         << "sourceStart=" << sourceStart << "sourceEnd=" << sourceEnd
                         << "sourceParent=" << sourceParent
                         << "sourceParent data=" << model->data(sourceParent).toString()
                         << "destinationParent=" << destinationParent
                         << "destinationRow=" << destinationRow;
}